

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O1

void CRenderTools::RenderEvalEnvelope
               (CEnvPoint *pPoints,int NumPoints,int Channels,float Time,float *pResult)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 in_XMM1 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float p3;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (NumPoints != 1) {
    if (NumPoints == 0) {
      fVar11 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      goto LAB_0018b3b5;
    }
    lVar7 = (long)(int)(NumPoints - 1U);
    auVar16._4_12_ = in_XMM1._4_12_;
    auVar16._0_4_ = (float)pPoints[lVar7].super_CEnvPoint_v1.m_Time / 1000.0;
    fVar11 = (float)FUN_00114d40(Time,auVar16._0_8_);
    bVar5 = 1 < NumPoints;
    if (1 < NumPoints) {
      fVar11 = fVar11 * 1000.0;
      piVar9 = pPoints[1].m_aInTangentdy;
      uVar6 = 1;
      while( true ) {
        fVar13 = (float)piVar9[-0x20];
        if ((fVar13 <= fVar11) &&
           (iVar4 = (((CEnvPoint *)(piVar9 + -10))->super_CEnvPoint_v1).m_Time,
           fVar11 <= (float)iVar4)) break;
        bVar5 = (long)uVar6 < lVar7;
        piVar9 = piVar9 + 0x16;
        bVar10 = uVar6 == NumPoints - 1U;
        uVar6 = uVar6 + 1;
        if (bVar10) goto LAB_0018b3a1;
      }
      fVar13 = (fVar11 - fVar13) / (float)(iVar4 - piVar9[-0x20]);
      switch(piVar9[-0x1f]) {
      case 0:
        fVar13 = 0.0;
        break;
      case 2:
        fVar13 = fVar13 * fVar13 * fVar13;
        break;
      case 3:
        fVar13 = 1.0 - fVar13;
        fVar13 = 1.0 - fVar13 * fVar13 * fVar13;
        break;
      case 4:
        fVar13 = fVar13 * -2.0 * fVar13 * fVar13 + fVar13 * 3.0 * fVar13;
        break;
      case 5:
        if (0 < Channels) {
          uVar6 = 0;
          piVar8 = piVar9;
          do {
            auVar19._0_4_ = (float)piVar9[-0x20];
            auVar19._4_4_ = (float)piVar8[-0x12];
            auVar19._8_8_ = 0;
            auVar16 = divps(auVar19,_DAT_001df910);
            auVar18._0_4_ = (float)(((CEnvPoint *)(piVar9 + -10))->super_CEnvPoint_v1).m_Time;
            auVar18._4_4_ = (float)piVar8[-4];
            auVar18._8_8_ = 0;
            auVar19 = divps(auVar18,_DAT_001df910);
            fVar14 = auVar16._0_4_;
            fVar15 = auVar16._4_4_ + fVar14;
            p3 = auVar19._0_4_;
            fVar17 = auVar19._4_4_ + p3;
            fVar13 = p3;
            if (fVar15 <= p3) {
              fVar13 = fVar15;
            }
            fVar12 = p3;
            if (fVar17 <= p3) {
              fVar12 = fVar17;
            }
            iVar4 = piVar8[-8];
            iVar1 = piVar8[-0x1e];
            iVar2 = *piVar8;
            iVar3 = piVar8[-0xe];
            fVar14 = SolveBezier(fVar11 / 1000.0,fVar14,
                                 (float)(-(uint)(fVar15 < fVar14) & (uint)fVar14 |
                                        ~-(uint)(fVar15 < fVar14) & (uint)fVar13),
                                 (float)(-(uint)(fVar17 < fVar14) & (uint)fVar14 |
                                        ~-(uint)(fVar17 < fVar14) & (uint)fVar12),p3);
            fVar13 = 1.0;
            if (fVar14 <= 1.0) {
              fVar13 = fVar14;
            }
            fVar15 = (float)iVar1 * 0.0009765625;
            fVar13 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar13);
            fVar17 = (float)iVar2 * 0.0009765625 + (float)iVar4 * 0.0009765625;
            fVar14 = (float)iVar3 * 0.0009765625 + fVar15;
            fVar15 = (fVar14 - fVar15) * fVar13 + fVar15;
            fVar14 = (fVar17 - fVar14) * fVar13 + fVar14;
            fVar15 = (fVar14 - fVar15) * fVar13 + fVar15;
            pResult[uVar6] =
                 ((((((float)iVar4 * 0.0009765625 - fVar17) * fVar13 + fVar17) - fVar14) * fVar13 +
                  fVar14) - fVar15) * fVar13 + fVar15;
            uVar6 = uVar6 + 1;
            piVar8 = piVar8 + 1;
          } while ((uint)Channels != uVar6);
        }
        goto LAB_0018b39b;
      }
      if (0 < Channels) {
        piVar9 = piVar9 + -8;
        uVar6 = 0;
        do {
          pResult[uVar6] =
               ((float)*piVar9 * 0.0009765625 - (float)piVar9[-0x16] * 0.0009765625) * fVar13 +
               (float)piVar9[-0x16] * 0.0009765625;
          uVar6 = uVar6 + 1;
          piVar9 = piVar9 + 1;
        } while ((uint)Channels != uVar6);
      }
LAB_0018b39b:
      if (bVar5) {
        return;
      }
    }
LAB_0018b3a1:
    pPoints = pPoints + lVar7;
  }
  fVar11 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[0] * 0.0009765625;
  fVar13 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[1] * 0.0009765625;
  fVar14 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[2] * 0.0009765625;
  fVar15 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[3] * 0.0009765625;
LAB_0018b3b5:
  *pResult = fVar11;
  pResult[1] = fVar13;
  pResult[2] = fVar14;
  pResult[3] = fVar15;
  return;
}

Assistant:

void CRenderTools::RenderEvalEnvelope(const CEnvPoint *pPoints, int NumPoints, int Channels, float Time, float *pResult)
{
	if(NumPoints == 0)
	{
		pResult[0] = 0;
		pResult[1] = 0;
		pResult[2] = 0;
		pResult[3] = 0;
		return;
	}

	if(NumPoints == 1)
	{
		pResult[0] = fx2f(pPoints[0].m_aValues[0]);
		pResult[1] = fx2f(pPoints[0].m_aValues[1]);
		pResult[2] = fx2f(pPoints[0].m_aValues[2]);
		pResult[3] = fx2f(pPoints[0].m_aValues[3]);
		return;
	}

	Time = fmod(Time, pPoints[NumPoints-1].m_Time/1000.0f)*1000.0f;

	for(int i = 0; i < NumPoints-1; i++)
	{
		if(Time >= pPoints[i].m_Time && Time <= pPoints[i+1].m_Time)
		{
			float Delta = pPoints[i+1].m_Time-pPoints[i].m_Time;
			float a = (Time-pPoints[i].m_Time)/Delta;

			switch(pPoints[i].m_Curvetype)
			{
			case CURVETYPE_STEP:
				a = 0;
				break;
			case CURVETYPE_SMOOTH:
				a = -2*a*a*a + 3*a*a; // second hermite basis
				break;
			case CURVETYPE_SLOW:
				a = a*a*a;
				break;
			case CURVETYPE_FAST:
				a = 1-a;
				a = 1-a*a*a;
				break;
			case CURVETYPE_BEZIER:
				for(int c = 0; c < Channels; c++)
				{
					// monotonic 2d cubic bezier curve
					vec2 p0, p1, p2, p3;
					vec2 inTang, outTang;

					p0 = vec2(pPoints[i].m_Time/1000.0f, fx2f(pPoints[i].m_aValues[c]));
					p3 = vec2(pPoints[i+1].m_Time/1000.0f, fx2f(pPoints[i+1].m_aValues[c]));

					outTang = vec2(pPoints[i].m_aOutTangentdx[c]/1000.0f, fx2f(pPoints[i].m_aOutTangentdy[c]));
					inTang = -vec2(pPoints[i+1].m_aInTangentdx[c]/1000.0f, fx2f(pPoints[i+1].m_aInTangentdy[c]));
					p1 = p0 + outTang;
					p2 = p3 - inTang;

					// validate bezier curve
					ValidateFCurve(p0, p1, p2, p3);

					// solve x(a) = time for a
					a = clamp(SolveBezier(Time/1000.0f, p0.x, p1.x, p2.x, p3.x), 0.0f, 1.0f);

					// value = y(t)
					pResult[c] =  bezier(p0.y, p1.y, p2.y, p3.y, a);
				}
				return;
			case CURVETYPE_LINEAR:
				break;
			}

			for(int c = 0; c < Channels; c++)
			{
				float v0 = fx2f(pPoints[i].m_aValues[c]);
				float v1 = fx2f(pPoints[i+1].m_aValues[c]);
				pResult[c] = mix(v0, v1, a);
			}

			return;
		}
	}

	pResult[0] = fx2f(pPoints[NumPoints-1].m_aValues[0]);
	pResult[1] = fx2f(pPoints[NumPoints-1].m_aValues[1]);
	pResult[2] = fx2f(pPoints[NumPoints-1].m_aValues[2]);
	pResult[3] = fx2f(pPoints[NumPoints-1].m_aValues[3]);
	return;
}